

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextmarkdownwriter.cpp
# Opt level: O0

int nearestWordWrapIndex(QString *s,int before)

{
  bool bVar1;
  Promoted<int,_long_long> PVar2;
  int *piVar3;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  int i;
  int fragBegin;
  QString frag;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_3;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  undefined4 in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  undefined4 in_stack_fffffffffffffe28;
  int iVar4;
  int local_1c4;
  char local_1c0 [36];
  undefined2 local_19c;
  undefined2 local_19a;
  QString local_198 [3];
  QDebug local_148;
  char16_t local_13e;
  undefined2 local_13c;
  undefined2 local_13a;
  QString local_138 [3];
  QDebug local_e8 [5];
  QDebug local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  int local_a0;
  int local_9c;
  qsizetype local_98;
  int local_8c;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_98 = QString::size((QString *)in_RDI);
  PVar2 = qMin<int,long_long>(&local_8c,&local_98);
  local_8c = (int)PVar2;
  local_9c = local_8c + -0xf;
  local_a0 = 0;
  piVar3 = qMax<int>(&local_9c,&local_a0);
  iVar4 = *piVar3;
  lcMDW();
  bVar1 = QLoggingCategory::isDebugEnabled((QLoggingCategory *)0xa1db06);
  local_1c4 = local_8c;
  if (bVar1) {
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    local_b0 = &DAT_aaaaaaaaaaaaaaaa;
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    QString::mid((longlong)&local_b8,(longlong)in_RDI);
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    lcMDW();
    anon_unknown.dwarf_1af7210::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_1af7210::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xa1dbab);
      QMessageLogger::QMessageLogger
                (in_RDI,(char *)CONCAT44(iVar4,in_stack_fffffffffffffe28),in_stack_fffffffffffffe24,
                 (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                 (char *)0xa1dbc4);
      QMessageLogger::debug();
      QDebug::operator<<((QDebug *)in_RDI,(QString *)CONCAT44(iVar4,in_stack_fffffffffffffe28));
      QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                         in_stack_fffffffffffffe1c);
      QDebug::~QDebug(&local_c0);
      local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
    }
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    lcMDW();
    anon_unknown.dwarf_1af7210::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
      anon_unknown.dwarf_1af7210::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xa1dc6d);
      QMessageLogger::QMessageLogger
                (in_RDI,(char *)CONCAT44(iVar4,in_stack_fffffffffffffe28),in_stack_fffffffffffffe24,
                 (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                 (char *)0xa1dc86);
      QMessageLogger::debug();
      local_13a = 0x2e;
      QString::QString(local_138,(long)(local_8c - iVar4),(QChar)0x2e);
      local_13c = 0x3c;
      operator+((QString *)CONCAT44(iVar4,in_stack_fffffffffffffe28),
                (char16_t *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
      QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QString,_char16_t> *)
                 CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      QDebug::operator<<((QDebug *)in_RDI,(QString *)CONCAT44(iVar4,in_stack_fffffffffffffe28));
      QString::~QString((QString *)0xa1dd2b);
      QStringBuilder<QString,_char16_t>::~QStringBuilder
                ((QStringBuilder<QString,_char16_t> *)0xa1dd38);
      QString::~QString((QString *)0xa1dd45);
      QDebug::~QDebug(local_e8);
      local_20 = (undefined1 *)((ulong)local_20 & 0xffffffffffffff00);
    }
    QString::~QString((QString *)0xa1dd6c);
    local_1c4 = local_8c;
  }
  do {
    local_1c4 = local_1c4 + -1;
    if (local_1c4 < 0) {
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      local_80 = &DAT_aaaaaaaaaaaaaaaa;
      lcMDW();
      anon_unknown.dwarf_1af7210::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                 CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_88), bVar1) {
        anon_unknown.dwarf_1af7210::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xa1df57);
        QMessageLogger::QMessageLogger
                  (in_RDI,(char *)CONCAT44(iVar4,local_1c4),in_stack_fffffffffffffe24,
                   (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                   (char *)0xa1df6d);
        QMessageLogger::debug(local_1c0,"not possible");
        local_80 = (undefined1 *)((ulong)local_80 & 0xffffffffffffff00);
      }
      local_1c4 = -1;
      goto LAB_00a1df92;
    }
    local_13e = (char16_t)
                QString::at((QString *)CONCAT44(iVar4,local_1c4),
                            CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    bVar1 = QChar::isSpace((QChar *)0xa1dda9);
  } while (!bVar1);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  lcMDW();
  anon_unknown.dwarf_1af7210::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_58), bVar1) {
    anon_unknown.dwarf_1af7210::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xa1de08);
    QMessageLogger::QMessageLogger
              (in_RDI,(char *)CONCAT44(iVar4,local_1c4),in_stack_fffffffffffffe24,
               (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
               (char *)0xa1de21);
    QMessageLogger::debug();
    local_19a = 0x2e;
    QString::QString(local_198,(long)(local_1c4 - iVar4),(QChar)0x2e);
    local_19c = 0x5e;
    operator+((QString *)CONCAT44(iVar4,local_1c4),
              (char16_t *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QString,_char16_t> *)
               CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    QDebug::operator<<((QDebug *)in_RDI,(QString *)CONCAT44(iVar4,local_1c4));
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                       in_stack_fffffffffffffe1c);
    QString::~QString((QString *)0xa1deb4);
    QStringBuilder<QString,_char16_t>::~QStringBuilder
              ((QStringBuilder<QString,_char16_t> *)0xa1dec1);
    QString::~QString((QString *)0xa1decb);
    QDebug::~QDebug(&local_148);
    local_50 = (undefined1 *)((ulong)local_50 & 0xffffffffffffff00);
  }
LAB_00a1df92:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_1c4;
}

Assistant:

static int nearestWordWrapIndex(const QString &s, int before)
{
    before = qMin(before, s.size());
    int fragBegin = qMax(before - 15, 0);
    if (lcMDW().isDebugEnabled()) {
        QString frag = s.mid(fragBegin, 30);
        qCDebug(lcMDW) << frag << before;
        qCDebug(lcMDW) << QString(before - fragBegin, qtmw_Period) + u'<';
    }
    for (int i = before - 1; i >= 0; --i) {
        if (s.at(i).isSpace()) {
            qCDebug(lcMDW) << QString(i - fragBegin, qtmw_Period) + u'^' << i;
            return i;
        }
    }
    qCDebug(lcMDW, "not possible");
    return -1;
}